

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O2

void nng_http_client_connect(nng_http_client *cli,nng_aio *aio)

{
  nni_http_client_connect(cli,aio);
  return;
}

Assistant:

void
nng_http_client_connect(nng_http_client *cli, nng_aio *aio)
{
#ifdef NNG_SUPP_HTTP
	nni_http_client_connect(cli, aio);
#else
	NNI_ARG_UNUSED(cli);
	nni_aio_finish_error(aio, NNG_ENOTSUP);
#endif
}